

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_optimization.cc
# Opt level: O2

void __thiscall QPDF::ObjUser::ObjUser(ObjUser *this,user_e type,string *key)

{
  this->ou_type = type;
  this->pageno = 0;
  std::__cxx11::string::string((string *)&this->key,(string *)key);
  if (type - ou_trailer_key < 2) {
    return;
  }
  __assert_fail("(type == ou_trailer_key) || (type == ou_root_key)",
                "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDF_optimization.cc"
                ,0x1d,"QPDF::ObjUser::ObjUser(user_e, const std::string &)");
}

Assistant:

QPDF::ObjUser::ObjUser(user_e type, std::string const& key) :
    ou_type(type),
    key(key)
{
    qpdf_assert_debug((type == ou_trailer_key) || (type == ou_root_key));
}